

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ismsnoop.cpp
# Opt level: O0

ISMSnoopInstrument * ismsnoop_open(char *path)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  FileVersion file_version;
  DataType DVar3;
  streamoff sVar4;
  element_type *this;
  ISMSnoopInstrument *this_00;
  char *pcVar5;
  allocator<char> local_309;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_308;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_300;
  string local_2f8 [39];
  allocator_type local_2d1;
  undefined1 local_2d0 [8];
  vector<char,_std::allocator<char>_> buffer;
  uint32_t name_length;
  int image_size;
  int channels;
  int iStack_2a4;
  uint16_t depth;
  uint16_t height;
  uint16_t width;
  uint32_t file_name_length;
  DataType local_28c;
  DataType data_type;
  char local_259;
  ISMSnoopInstrument *pIStack_258;
  char magic_byte;
  ISMSnoopInstrument *result;
  shared_ptr<ismsnoop::VersionHandler> handler;
  pos_type file_length;
  ifstream local_220 [8];
  ifstream ifs;
  char *path_local;
  
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_220,path,_Var2);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    path_local = (char *)0x0;
  }
  else {
    std::istream::seekg((long)local_220,_S_beg);
    handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::istream::tellg();
    sVar4 = std::fpos::operator_cast_to_long
                      ((fpos *)&handler.
                                super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
    if (sVar4 < 0x24) {
      path_local = (char *)0x0;
    }
    else {
      file_version = ismsnoop::read_file_version(local_220);
      ismsnoop::make_handler((ismsnoop *)&result,file_version);
      this = std::
             __shared_ptr_access<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&result);
      ismsnoop::VersionHandler::find_panel_icon(this,local_220);
      this_00 = (ISMSnoopInstrument *)operator_new(0x48);
      (this_00->name)._M_string_length = 0;
      (this_00->name).field_2._M_allocated_capacity = 0;
      *(undefined8 *)
       &(this_00->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        field_0x10 = 0;
      *(undefined8 *)&this_00->name = 0;
      *(undefined8 *)
       &(this_00->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
      *(undefined8 *)
       &(this_00->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        field_0x8 = 0;
      (this_00->panel_icon).width = 0;
      (this_00->panel_icon).height = 0;
      *(undefined8 *)&(this_00->panel_icon).depth = 0;
      *(undefined8 *)((long)&(this_00->name).field_2 + 8) = 0;
      ISMSnoopInstrument::ISMSnoopInstrument(this_00);
      pIStack_258 = this_00;
      std::istream::get((char *)local_220);
      if (local_259 == '\0') {
        (pIStack_258->panel_icon).width = 0;
        (pIStack_258->panel_icon).height = 0;
        (pIStack_258->panel_icon).depth = 0;
        std::istream::seekg((long)local_220,_S_end|_S_cur);
      }
      else {
        std::istream::seekg((long)local_220,7);
        ismsnoop::read_panel_icon((InstrumentImage *)&stack0xfffffffffffffd78,local_220);
        ismsnoop::InstrumentImage::operator=
                  (&pIStack_258->panel_icon,(InstrumentImage *)&stack0xfffffffffffffd78);
        ismsnoop::InstrumentImage::~InstrumentImage((InstrumentImage *)&stack0xfffffffffffffd78);
      }
      do {
        while( true ) {
          std::shared_ptr<ismsnoop::VersionHandler>::shared_ptr
                    ((shared_ptr<ismsnoop::VersionHandler> *)&height,
                     (shared_ptr<ismsnoop::VersionHandler> *)&result);
          DVar3 = ismsnoop::find_data(local_220,(shared_ptr<ismsnoop::VersionHandler> *)&height);
          local_28c = DVar3;
          std::shared_ptr<ismsnoop::VersionHandler>::~shared_ptr
                    ((shared_ptr<ismsnoop::VersionHandler> *)&height);
          if (DVar3 == None) {
            path_local = (char *)pIStack_258;
            goto LAB_0010e818;
          }
          if (local_28c != BackgroundImage) break;
          std::istream::read((char *)local_220,(long)&stack0xfffffffffffffd5c);
          std::istream::seekg((long)local_220,iStack_2a4 + 0x2d);
          std::istream::read((char *)local_220,(long)&channels + 2);
          std::istream::read((char *)local_220,(long)&channels);
          std::istream::read((char *)local_220,(long)&image_size + 2);
          buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
               (uint)channels._2_2_ * (uint)(ushort)channels * (uint)(image_size._2_2_ >> 3);
          std::istream::seekg((long)local_220,
                              buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_)
          ;
        }
      } while (local_28c != InfoText);
      std::istream::read((char *)local_220,
                         (long)&buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                field_0x10);
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_2d0,
                 (ulong)(uint)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
                 &local_2d1);
      std::allocator<char>::~allocator(&local_2d1);
      pcVar5 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_2d0);
      std::istream::read((char *)local_220,(long)pcVar5);
      local_300._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)local_2d0);
      local_308._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)local_2d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (local_2f8,local_300,local_308,&local_309);
      std::__cxx11::string::operator=((string *)&pIStack_258->name,local_2f8);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator(&local_309);
      path_local = (char *)pIStack_258;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_2d0);
LAB_0010e818:
      std::shared_ptr<ismsnoop::VersionHandler>::~shared_ptr
                ((shared_ptr<ismsnoop::VersionHandler> *)&result);
    }
  }
  std::ifstream::~ifstream(local_220);
  return (ISMSnoopInstrument *)path_local;
}

Assistant:

ISMSnoopInstrument * ismsnoop_open(const char * path)
{
	std::ifstream ifs(path, std::ios_base::in | std::ios_base::binary);

	if(!ifs.good())
	{
		return nullptr;
	}

	ifs.seekg(0, std::ios::end);

	const auto file_length = ifs.tellg();

	if(file_length < ismsnoop::VERSION_INFO)
	{
		return nullptr;
	}

	const auto handler = make_handler(ismsnoop::read_file_version(ifs));

	handler->find_panel_icon(ifs);

	const auto result = new ISMSnoopInstrument();

	char magic_byte;

	ifs.get(magic_byte);

	if (magic_byte == 0)
	{
		// no panel icon
		result->panel_icon.width = 0;
		result->panel_icon.height = 0;
		result->panel_icon.depth = 0;

		ifs.seekg(3, std::ios::cur);
	}
	else
	{
		ifs.seekg(7, std::ios::cur);

		result->panel_icon = ismsnoop::read_panel_icon(ifs);
	}

	ismsnoop::DataType data_type;

	//while (!ifs.eof())
	while ((data_type = find_data(ifs, handler)) != ismsnoop::DataType::None)
	{
		//data_type = find_data(ifs);
		switch (data_type)
		{
			case ismsnoop::DataType::BackgroundImage:
			{
				uint32_t file_name_length;

				ifs.read((char*)(&file_name_length), 4);

				ifs.seekg(45 + file_name_length, std::ios::cur);

				uint16_t width, height, depth;

				ifs.read((char*)(&width), 2);
				ifs.read((char*)(&height), 2);
				ifs.read((char*)(&depth), 2);

				const auto channels = depth / 8;
				const auto image_size = width * height * channels;

				ifs.seekg(image_size, std::ios::cur);

				break;
			}

			case ismsnoop::DataType::InfoText:
			{
				uint32_t name_length;

				ifs.read((char*)(&name_length), 4);

				std::vector<char> buffer(name_length);

				ifs.read(buffer.data(), name_length);

				result->name = std::string(buffer.begin(), buffer.end());

				return result;
			}

			default:
			{
				break;
			}
		}
	}

	return result;
}